

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RDI;
  size_t neededSpace;
  size_t ldmSeqSpace;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  ZSTD_compressionParameters cParams;
  size_t in_stack_ffffffffffffff30;
  U64 in_stack_ffffffffffffff38;
  ZSTD_CCtx_params *in_stack_ffffffffffffff40;
  ulong local_b8;
  ZSTD_compressionParameters local_2c;
  long local_10;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0x38) == 0) {
    local_10 = in_RDI;
    ZSTD_getCParamsFromCCtxParams
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if ((ulong)(1L << ((byte)local_2c.windowLog & 0x3f)) < 0x20001) {
      local_b8 = 1L << ((byte)local_2c.windowLog & 0x3f);
    }
    else {
      local_b8 = 0x20000;
    }
    uVar1 = 4;
    if (local_2c.searchLength == 3) {
      uVar1 = 3;
    }
    sVar2 = ZSTD_sizeof_matchState(&local_2c,1);
    sVar3 = ZSTD_ldm_getTableSize(*(ldmParams_t *)(local_10 + 0x44));
    sVar4 = ZSTD_ldm_getMaxNbSeq(*(ldmParams_t *)(local_10 + 0x44),local_b8);
    local_8 = local_b8 + (local_b8 / uVar1) * 0xb + sVar2 + sVar3 + sVar4 * 0xc + 0x3f70;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    /* Estimate CCtx size is supported for single-threaded compression only. */
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, 0, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.searchLength==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = blockSize + 11*maxNbSeq;
        size_t const entropySpace = HUF_WORKSPACE_SIZE;
        size_t const blockStateSpace = 2 * sizeof(ZSTD_compressedBlockState_t);
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq);

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)sizeof(ZSTD_CCtx));
        DEBUGLOG(5, "estimate workSpace : %u", (U32)neededSpace);
        return sizeof(ZSTD_CCtx) + neededSpace;
    }
}